

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

void __thiscall
Time::LocalTime::LocalTime
          (LocalTime *this,int year,int month,int dayOfMonth,int hour,int min,int sec)

{
  time_t tVar1;
  tm local_68;
  
  tVar1 = time((time_t *)0x0);
  (this->super_Time).timeSinceEpoch.tv_sec = tVar1;
  (this->super_Time).timeSinceEpoch.tv_usec = 0;
  (this->super_Time)._vptr_Time = (_func_int **)&PTR_getAsDate_00125cd0;
  local_68.tm_sec = sec;
  local_68.tm_isdst = -1;
  local_68.tm_min = min;
  local_68.tm_hour = hour;
  local_68.tm_mday = dayOfMonth;
  local_68.tm_mon = month;
  local_68.tm_year = year;
  tVar1 = mktime(&local_68);
  (this->super_Time).timeSinceEpoch.tv_sec = tVar1;
  return;
}

Assistant:

LocalTime::LocalTime(const int year, const int month, const int dayOfMonth, const int hour, const int min, const int sec)
        : Time(time(NULL), 0)
    {
        struct tm tmt;
        tmt.tm_year = year;
        tmt.tm_mon = month;
        tmt.tm_mday = dayOfMonth;
        tmt.tm_hour = hour;
        tmt.tm_min = min;
        tmt.tm_sec = sec;
        tmt.tm_isdst = -1;
        timeSinceEpoch.tv_sec = makeTime(&tmt);
    }